

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O1

size_t __thiscall czh::file::StreamFile::get_lineno(StreamFile *this,size_t pos)

{
  basic_ifstream<char,_std::char_traits<char>_> *pbVar1;
  char cVar2;
  istream *piVar3;
  ulong uVar4;
  size_t sVar5;
  string tmp;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  pbVar1 = (this->file)._M_t.
           super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  std::ios::clear((int)pbVar1 + (int)*(undefined8 *)(*(long *)pbVar1 + -0x18));
  std::istream::seekg((this->file)._M_t.
                      super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,0,0);
  sVar5 = 1;
  uVar4 = 0;
  while( true ) {
    piVar3 = (istream *)
             (this->file)._M_t.
             super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl;
    cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar3 + -0x18) + (char)piVar3);
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (piVar3,(string *)&local_50,cVar2);
    if ((((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) ||
       (uVar4 = uVar4 + local_48 + 1, pos <= uVar4)) break;
    sVar5 = sVar5 + 1;
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return sVar5;
}

Assistant:

[[nodiscard]] std::size_t get_lineno(std::size_t pos) const override
    {
      std::size_t lineno = 1;
      std::size_t postmp = 0;
      std::string tmp;
      file->clear();
      file->seekg(std::ios::beg);
      for (; std::getline(*file, tmp); lineno++)
      {
        postmp += tmp.size() + 1;
        if (postmp >= pos) break;
      }
      return lineno;
    }